

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void communicate(char *file_memory,Arguments *args)

{
  Benchmarks *bench_00;
  int *in_RSI;
  atomic_char *in_RDI;
  atomic_char *guard;
  void *buffer;
  Benchmarks *in_stack_00000010;
  int message;
  Benchmarks bench;
  int local_44;
  
  bench_00 = (Benchmarks *)malloc((long)*in_RSI);
  mmap_wait(in_RDI);
  setup_benchmarks((Benchmarks *)0x1023cc);
  for (local_44 = 0; local_44 < in_RSI[1]; local_44 = local_44 + 1) {
    now();
    memset(in_RDI,0x2a,(long)*in_RSI);
    mmap_notify(in_RDI);
    mmap_wait(in_RDI);
    memcpy(bench_00,in_RDI,(long)*in_RSI);
    benchmark(bench_00);
  }
  evaluate(in_stack_00000010,(Arguments *)buffer);
  free(bench_00);
  return;
}

Assistant:

void communicate(char *file_memory, struct Arguments *args) {
	struct Benchmarks bench;
	int message;
	void *buffer = malloc(args->size);
	atomic_char *guard = (atomic_char *)file_memory;

	mmap_wait(guard);
	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		memset(file_memory, '*', args->size);

		mmap_notify(guard);
		mmap_wait(guard);

		memcpy(buffer, file_memory, args->size);

		benchmark(&bench);
	}

	evaluate(&bench, args);
	free(buffer);
}